

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum2>::notify
          (PromiseData<(anonymous_namespace)::Enum2> *this,QVector<Handler> *handlers)

{
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char cVar3;
  QObject *pQVar4;
  QEvent *this_00;
  QThread *pQVar5;
  function<void_(const_double_&)> *__x;
  long lVar6;
  PromiseValue<(anonymous_namespace)::Enum2> value;
  function<void_(const_(anonymous_namespace)::Enum2_&)> local_60;
  PromiseValue<(anonymous_namespace)::Enum2> local_40;
  
  PromiseValue<(anonymous_namespace)::Enum2>::PromiseValue(&value,&this->m_value);
  ppVar1 = (handlers->d).ptr;
  lVar6 = (handlers->d).size * 0x30;
  do {
    __x = &ppVar1->second;
    if (lVar6 == 0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.m_data.
                  super___shared_ptr<(anonymous_namespace)::Enum2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    std::function<void_(const_(anonymous_namespace)::Enum2_&)>::function
              (&local_60,(function<void_(const_(anonymous_namespace)::Enum2_&)> *)__x);
    PromiseValue<(anonymous_namespace)::Enum2>::PromiseValue(&local_40,&value);
    if ((*(long *)((long)(__x + -1) + 0x10) != 0) &&
       (*(long *)((long)(__x + -1) + 0x18) != 0 &&
        *(int *)(*(long *)((long)(__x + -1) + 0x10) + 4) != 0)) {
      cVar3 = QThread::isFinished();
      if (cVar3 == '\0') {
        if ((*(long *)((long)(__x + -1) + 0x10) == 0) ||
           (*(int *)(*(long *)((long)(__x + -1) + 0x10) + 4) == 0)) {
          pQVar5 = (QThread *)0x0;
        }
        else {
          pQVar5 = *(QThread **)((long)(__x + -1) + 0x18);
        }
        pQVar4 = (QObject *)QAbstractEventDispatcher::instance(pQVar5);
        if (pQVar4 == (QObject *)0x0) {
          cVar3 = QCoreApplication::closingDown();
          if (cVar3 != '\0') goto LAB_00111fa4;
        }
        this_00 = (QEvent *)operator_new(0x40);
        QEvent::QEvent(this_00,None);
        *(undefined ***)this_00 = &PTR__Event_00147890;
        std::function<void_(const_(anonymous_namespace)::Enum2_&)>::function
                  ((function<void_(const_(anonymous_namespace)::Enum2_&)> *)(this_00 + 0x10),
                   &local_60);
        _Var2._M_pi = local_40.m_data.
                      super___shared_ptr<(anonymous_namespace)::Enum2,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_40.m_data.super___shared_ptr<(anonymous_namespace)::Enum2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)(this_00 + 0x30) =
             local_40.m_data.
             super___shared_ptr<(anonymous_namespace)::Enum2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_00 + 0x38) = _Var2._M_pi;
        local_40.m_data.super___shared_ptr<(anonymous_namespace)::Enum2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        QCoreApplication::postEvent(pQVar4,this_00,0);
      }
    }
LAB_00111fa4:
    notify(QList<std::pair<QPointer<QThread>,std::function<void((anonymous_namespace)::Enum2_const&)>>>const&)
    ::{lambda()#1}::~QList((_lambda___1_ *)&local_60);
    ppVar1 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)(__x + 1);
    lVar6 = lVar6 + -0x30;
  } while( true );
}

Assistant:

void notify(const QVector<Handler>& handlers) Q_DECL_OVERRIDE
    {
        PromiseValue<T> value = m_value;
        Q_ASSERT(!value.isNull());

        for (const auto& handler : handlers) {
            const auto& fn = handler.second;
            qtpromise_defer(
                [=]() {
                    fn(value.data());
                },
                handler.first);
        }
    }